

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReport.cpp
# Opt level: O3

void __thiscall
KDReports::ReportPrivate::setPaperSizeFromPrinter(ReportPrivate *this,QSizeF paperSize)

{
  qreal qVar1;
  qreal w;
  double w_00;
  
  if (this->m_layoutWidth <= 0.0) {
    (this->m_paperSize).wd = paperSize.wd;
    (this->m_paperSize).ht = paperSize.ht;
    qVar1 = mmToPixels(this->m_marginLeft + this->m_marginRight);
    w_00 = (this->m_paperSize).wd - qVar1;
    HeaderMap::layoutWithTextWidth(&this->m_headers,w_00);
    HeaderMap::layoutWithTextWidth(&this->m_footers,w_00);
    qVar1 = mainTextDocHeight(this);
    (*this->m_layout->_vptr_AbstractReportLayout[7])(w_00,qVar1);
    this->m_pageContentSizeDirty = false;
    return;
  }
  setPaperSizeFromPrinter();
  HeaderMap::layoutWithTextWidth(&this->m_headers,w);
  HeaderMap::layoutWithTextWidth(&this->m_footers,w);
  (*this->m_layout->_vptr_AbstractReportLayout[8])(w);
  mmToPixels(this->m_marginLeft + this->m_marginRight);
  mmToPixels(this->m_marginTop + this->m_marginBottom);
  HeaderMap::height(&this->m_headers);
  HeaderMap::height(&this->m_footers);
  this->m_pageContentSizeDirty = false;
  return;
}

Assistant:

bool KDReports::ReportPrivate::wantEndlessPrinting() const
{
    return m_layoutWidth > 0;
}